

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

char * nullcGetFunctionName(uint funcID)

{
  uint uVar1;
  char *__function;
  
  if (NULLCTypeInfo::linker == 0) {
    __assert_fail("NULLCTypeInfo::linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x1e7,"const char *nullcGetFunctionName(unsigned int)");
  }
  if (funcID < *(uint *)(NULLCTypeInfo::linker + 0x24c)) {
    uVar1 = *(uint *)(*(long *)(NULLCTypeInfo::linker + 0x240) + (ulong)funcID * 0x94);
    if (uVar1 < *(uint *)(NULLCTypeInfo::linker + 0x29c)) {
      return (char *)((ulong)uVar1 + *(long *)(NULLCTypeInfo::linker + 0x290));
    }
    __function = 
    "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  else {
    __function = 
    "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

const char*		nullcGetFunctionName(unsigned int funcID)
{
	assert(NULLCTypeInfo::linker);
	return &NULLCTypeInfo::linker->exSymbols[NULLCTypeInfo::linker->exFunctions[funcID].offsetToName];
}